

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void close_all_connections(Curl_multi *multi)

{
  undefined1 local_b8 [8];
  sigpipe_ignore pipe_st;
  connectdata *conn;
  Curl_multi *multi_local;
  
  pipe_st._152_8_ = Curl_conncache_find_first_connection(&multi->conn_cache);
  while (pipe_st._152_8_ != 0) {
    *(Curl_easy **)pipe_st._152_8_ = multi->closure_handle;
    sigpipe_ignore(*(Curl_easy **)pipe_st._152_8_,(sigpipe_ignore *)local_b8);
    *(undefined8 *)(*(long *)pipe_st._152_8_ + 0x10) = 0;
    Curl_conncontrol((connectdata *)pipe_st._152_8_,1);
    Curl_disconnect((connectdata *)pipe_st._152_8_,false);
    sigpipe_restore((sigpipe_ignore *)local_b8);
    pipe_st._152_8_ = Curl_conncache_find_first_connection(&multi->conn_cache);
  }
  return;
}

Assistant:

static void close_all_connections(struct Curl_multi *multi)
{
  struct connectdata *conn;

  conn = Curl_conncache_find_first_connection(&multi->conn_cache);
  while(conn) {
    SIGPIPE_VARIABLE(pipe_st);
    conn->data = multi->closure_handle;

    sigpipe_ignore(conn->data, &pipe_st);
    conn->data->easy_conn = NULL; /* clear the easy handle's connection
                                     pointer */
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    (void)Curl_disconnect(conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = Curl_conncache_find_first_connection(&multi->conn_cache);
  }
}